

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::EnumValueDescriptor::DebugStringWithOptions_abi_cxx11_
          (EnumValueDescriptor *this,DebugStringOptions *options)

{
  string *in_RDI;
  string *contents;
  DebugStringOptions *in_stack_000004f8;
  string *in_stack_00000500;
  int in_stack_0000050c;
  EnumValueDescriptor *in_stack_00000510;
  
  std::__cxx11::string::string((string *)in_RDI);
  DebugString(in_stack_00000510,in_stack_0000050c,in_stack_00000500,in_stack_000004f8);
  return in_RDI;
}

Assistant:

std::string EnumValueDescriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options);
  return contents;
}